

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTState *cts_00;
  CType *pCVar1;
  int iVar2;
  TValue *pTVar3;
  uint32_t uVar4;
  cTValue local_2d8;
  TValue tv;
  int ret;
  int gcsteps;
  CCallState cc;
  CType *pCStack_100;
  CTSize sz;
  CType *ct;
  CTState *cts;
  GCcdata *cd_local;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_c8;
  CType *ct_1;
  CType *local_a0;
  _func_void *local_80;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  for (local_c8 = cts_00->tab + cd->ctypeid; local_c8->info >> 0x1c == 8;
      local_c8 = cts_00->tab + (local_c8->info & 0xffff)) {
  }
  pCStack_100 = local_c8;
  cc.stack[0x1f]._4_4_ = 8;
  if (local_c8->info >> 0x1c == 2) {
    cc.stack[0x1f]._4_4_ = local_c8->size;
    local_a0 = local_c8;
    do {
      pCStack_100 = cts_00->tab + (local_a0->info & 0xffff);
      local_a0 = pCStack_100;
    } while (pCStack_100->info >> 0x1c == 8);
  }
  if (pCStack_100->info >> 0x1c == 6) {
    if (cc.stack[0x1f]._4_4_ == 4) {
      local_80 = (_func_void *)(ulong)(uint)cd[1].nextgc.gcptr64;
    }
    else {
      local_80 = (_func_void *)cd[1].nextgc.gcptr64;
    }
    _ret = local_80;
    tv.field_4.it = ccall_set_args(L,cts_00,pCStack_100,(CCallState *)&ret);
    pCVar1 = cts_00->tab;
    (cts_00->cb).slot = 0xffffffff;
    lj_vm_ffi_call(&ret);
    if ((cts_00->cb).slot != 0xffffffff) {
      local_2d8.u64 = (ulong)_ret >> 2;
      pTVar3 = lj_tab_set(L,cts_00->miscmap,&local_2d8);
      pTVar3->u64 = 0xfffeffffffffffff;
    }
    iVar2 = ccall_get_results(L,cts_00,(CType *)((long)pCStack_100 +
                                                ((long)cts_00->tab - (long)pCVar1)),
                              (CCallState *)&ret,(int *)&tv.it64);
    tv.field_4.it = iVar2 + tv.field_4.it;
    while (uVar4 = tv.field_4.it - 1, 0 < (int)tv.field_4.it) {
      tv.field_4.it = uVar4;
      if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
        lj_gc_step(L);
      }
    }
    L_local._4_4_ = tv.field_4.i;
  }
  else {
    L_local._4_4_ = -1;
  }
  return L_local._4_4_;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}